

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void toggle_widgetbin_cb(Fl_Widget *param_1,void *param_2)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  
  if (widgetbin_panel == (Fl_Window *)0x0) {
    make_widgetbin();
    cVar1 = position_window(widgetbin_panel,"widgetbin_pos",1,0x140,0x1e,0,0);
    if (cVar1 == '\0') {
      return;
    }
  }
  bVar3 = ((widgetbin_panel->super_Fl_Group).super_Fl_Widget.flags_ & 2) == 0;
  pcVar2 = "Hide Widget &Bin";
  if (bVar3) {
    pcVar2 = "Show Widget &Bin...";
  }
  (*(widgetbin_panel->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[(ulong)bVar3 + 5])();
  widgetbin_item->text = pcVar2;
  return;
}

Assistant:

void toggle_widgetbin_cb(Fl_Widget *, void *) {
  if (!widgetbin_panel) {
    make_widgetbin();
    if (!position_window(widgetbin_panel,"widgetbin_pos", 1, 320, 30)) return;
  }

  if (widgetbin_panel->visible()) {
    widgetbin_panel->hide();
    widgetbin_item->label("Show Widget &Bin...");
  } else {
    widgetbin_panel->show();
    widgetbin_item->label("Hide Widget &Bin");
  }
}